

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.cpp
# Opt level: O2

Matrix4d * __thiscall Pose::getT(Matrix4d *__return_storage_ptr__,Pose *this)

{
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar1;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_88;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_68 [72];
  
  getR((Matrix3d *)local_68,this);
  Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::
  CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>>
            ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_88,__return_storage_ptr__,
             local_68);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_88,
                      (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this);
  local_90 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar1,&local_90);
  local_98 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar1,&local_98);
  local_a0 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar1,&local_a0);
  local_a8 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar1,&local_a8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::finished(&local_88);
  return __return_storage_ptr__;
}

Assistant:

Matrix4d Pose::getT(){
      Matrix4d T;
      T <<  this->getR(), this->pos,
            0, 0, 0, 1;
      return T;
}